

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

Node __thiscall xt::vector::newPath(vector *this,uint level,Node *node)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Node *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Node NVar2;
  Node local_68;
  double local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  Object local_48;
  
  if (level == 0) {
    *(element_type **)this =
         (node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    *(undefined8 *)(this + 8) = 0;
    p_Var1 = (node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var1;
    (node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  }
  else {
    this_00 = (_Node *)operator_new(0x10);
    _Node::_Node(this_00);
    *(_Node **)this = this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<xt::_Node*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),this_00);
    local_68.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_68.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (node->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_68.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_68.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_68.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_68.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_68.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    newPath((vector *)&local_58,level - 5,&local_68);
    local_48.type = Pointer;
    local_48.typeinfo = (TypeInfo *)_Node::type_info;
    local_48.field_2.number = local_58;
    local_48.field_2.ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)local_50._M_pi;
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      }
    }
    Object::operator=(*(Object **)**(undefined8 **)this,&local_48);
    node = (Node *)extraout_RDX;
    if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      node = (Node *)extraout_RDX_00;
    }
    if (local_68.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      node = (Node *)extraout_RDX_01;
    }
  }
  NVar2.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node;
  NVar2.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Node)NVar2.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node newPath(unsigned int level, Node node) {
	if (level == 0) return node;
	Node ret = Node(new _Node);
	(*ret->array)[0] = newPath(level - 5, node);
	return ret;
}